

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

bool __thiscall
tinyusdz::primvar::PrimVar::get_interpolated_value<bool>
          (PrimVar *this,double t,TimeSampleInterpolationType tinterp,bool *v)

{
  undefined1 *puVar1;
  bool bVar2;
  pointer pSVar3;
  value_type_conflict *pvVar4;
  pointer pSVar5;
  optional<bool> pv_1;
  optional<bool> pv;
  undefined1 local_30 [16];
  
  if (v == (bool *)0x0) {
    return false;
  }
  if (NAN(t)) {
    local_30._8_8_ = t;
    get_default_value<bool>((PrimVar *)(local_30 + 4));
    if (local_30[4] == '\x01') {
      puVar1 = local_30 + 4;
      local_30[1] = local_30[5];
      goto LAB_001b9d8b;
    }
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    t = (double)local_30._8_8_;
    if (pSVar3 == pSVar5) {
      return false;
    }
  }
  else {
    pSVar3 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar5 = (this->_ts)._samples.
             super__Vector_base<tinyusdz::value::TimeSamples::Sample,_std::allocator<tinyusdz::value::TimeSamples::Sample>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  if (pSVar5 != pSVar3) {
    bVar2 = tinyusdz::value::TimeSamples::get<bool,_nullptr>(&this->_ts,v,t,tinterp);
    return bVar2;
  }
  bVar2 = has_value(this);
  if (bVar2) {
    get_default_value<bool>((PrimVar *)local_30);
    local_30[2] = local_30[0];
    if (local_30[0] != '\0') {
      puVar1 = local_30;
LAB_001b9d8b:
      ((optional<bool> *)(puVar1 + 2))->contained = (storage_t<bool>)local_30[1];
      pvVar4 = nonstd::optional_lite::optional<bool>::value((optional<bool> *)(puVar1 + 2));
      *v = *pvVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool get_interpolated_value(const double t, const value::TimeSampleInterpolationType tinterp, T *v) const {
    if (!v) {
      return false;
    }

    if (value::TimeCode(t).is_default()) {

      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }

      if (_ts.empty()) {
        return false;
      }
    }

    if (has_timesamples()) {
      return _ts.get(v, t, tinterp);
    }

    if (has_default()) {
      if (auto pv = get_default_value<T>()) {
        (*v) = pv.value();
        return true;
      }
    }

    return false;
  }